

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_frozen_view(char *buf,size_t length)

{
  uint8_t uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  char *res;
  ulong uVar5;
  roaring_bitmap_t *prVar6;
  char *res_1;
  long lVar7;
  void *pvVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  void *__ptr;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  uint8_t *puVar22;
  
  if ((3 < length && ((ulong)buf & 0x1f) == 0) &&
     (uVar15 = *(uint *)(buf + (length - 4)), (uVar15 & 0x7fff) == 0x35c6)) {
    uVar11 = uVar15 >> 0xf;
    uVar12 = (ulong)uVar11;
    if (uVar12 * 5 + 4 <= length) {
      lVar3 = length - 4;
      lVar4 = lVar3 - (ulong)(uVar11 * 3);
      puVar22 = (uint8_t *)(buf + (lVar3 - uVar12));
      uVar5 = 0;
      if (uVar15 < 0x8000) {
        lVar20 = 0;
        lVar18 = 0;
        lVar7 = 0;
        lVar14 = 0;
        lVar17 = 0;
      }
      else {
        uVar16 = 0;
        iVar13 = 0;
        iVar9 = 0;
        lVar7 = 0;
        lVar18 = 0;
        lVar20 = 0;
        do {
          uVar1 = puVar22[uVar16];
          if (uVar1 == '\x03') {
            iVar13 = iVar13 + 1;
            lVar18 = lVar18 + (ulong)*(ushort *)(buf + uVar16 * 2 + lVar4) * 4;
          }
          else if (uVar1 == '\x02') {
            iVar9 = iVar9 + 1;
            lVar7 = lVar7 + (ulong)*(ushort *)(buf + uVar16 * 2 + lVar4) * 2 + 2;
          }
          else {
            if (uVar1 != '\x01') {
              return (roaring_bitmap_t *)0x0;
            }
            uVar5 = (ulong)((int)uVar5 + 1);
            lVar20 = lVar20 + 0x2000;
          }
          uVar16 = uVar16 + 1;
        } while (uVar12 != uVar16);
        lVar17 = (long)(int)uVar5;
        lVar14 = (long)iVar13;
        uVar5 = (ulong)iVar9;
      }
      if (lVar7 + (ulong)(uVar11 * 5) + lVar20 + lVar18 + 4 == length) {
        prVar6 = (roaring_bitmap_t *)
                 malloc((lVar14 + uVar5 + lVar17) * 0x10 + (ulong)(uVar11 * 8) + 0x28);
        if (prVar6 != (roaring_bitmap_t *)0x0) {
          (prVar6->high_low_container).flags = '\x02';
          (prVar6->high_low_container).allocation_size = uVar11;
          (prVar6->high_low_container).size = uVar11;
          (prVar6->high_low_container).keys = (uint16_t *)(buf + (lVar3 - (ulong)(uVar11 * 5)));
          (prVar6->high_low_container).typecodes = puVar22;
          (prVar6->high_low_container).containers = (void **)(prVar6 + 1);
          if (uVar15 < 0x8000) {
            return prVar6;
          }
          pvVar8 = (void *)((long)&prVar6[1].high_low_container.size + (ulong)(uVar11 * 8));
          pcVar21 = buf + lVar20;
          pcVar19 = pcVar21 + lVar18;
          uVar12 = 0;
          pcVar10 = buf;
          __ptr = pvVar8;
          do {
            uVar1 = *puVar22;
            if (uVar1 == '\x03') {
              uVar2 = *(ushort *)(buf + uVar12 + lVar4);
              *(uint *)((long)pvVar8 + uVar12 * 8 + 4) = (uint)uVar2;
              *(uint *)((long)pvVar8 + uVar12 * 8) = (uint)uVar2;
              *(char **)((long)pvVar8 + uVar12 * 8 + 8) = pcVar21;
              *(void **)((long)(prVar6->high_low_container).containers + uVar12 * 4) = __ptr;
              pcVar21 = pcVar21 + (ulong)uVar2 * 4;
            }
            else if (uVar1 == '\x02') {
              uVar15 = *(ushort *)(buf + uVar12 + lVar4) + 1;
              *(uint *)((long)pvVar8 + uVar12 * 8 + 4) = uVar15;
              *(uint *)((long)pvVar8 + uVar12 * 8) = uVar15;
              *(char **)((long)pvVar8 + uVar12 * 8 + 8) = pcVar19;
              *(void **)((long)(prVar6->high_low_container).containers + uVar12 * 4) = __ptr;
              pcVar19 = pcVar19 + (ulong)uVar15 * 2;
            }
            else {
              if (uVar1 != '\x01') {
                free(__ptr);
                return (roaring_bitmap_t *)0x0;
              }
              *(char **)((long)pvVar8 + uVar12 * 8 + 8) = pcVar10;
              *(uint *)((long)pvVar8 + uVar12 * 8) = *(ushort *)(buf + uVar12 + lVar4) + 1;
              *(void **)((long)(prVar6->high_low_container).containers + uVar12 * 4) = __ptr;
              pcVar10 = pcVar10 + 0x2000;
            }
            __ptr = (void *)((long)__ptr + 0x10);
            uVar12 = uVar12 + 2;
            puVar22 = puVar22 + 1;
          } while (uVar11 * 2 != uVar12);
          return prVar6;
        }
      }
    }
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

const roaring_bitmap_t *
roaring_bitmap_frozen_view(const char *buf, size_t length) {
    if ((uintptr_t)buf % 32 != 0) {
        return NULL;
    }

    // cookie and num_containers
    if (length < 4) {
        return NULL;
    }
    uint32_t header;
    memcpy(&header, buf + length - 4, 4); // header may be misaligned
    if ((header & 0x7FFF) != FROZEN_COOKIE) {
        return NULL;
    }
    int32_t num_containers = (header >> 15);

    // typecodes, counts and keys
    if (length < 4 + (size_t)num_containers * (1 + 2 + 2)) {
        return NULL;
    }
    uint16_t *keys = (uint16_t *)(buf + length - 4 - num_containers * 5);
    uint16_t *counts = (uint16_t *)(buf + length - 4 - num_containers * 3);
    uint8_t *typecodes = (uint8_t *)(buf + length - 4 - num_containers * 1);

    // {bitset,array,run}_zone
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;
    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                num_bitset_containers++;
                bitset_zone_size += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            case RUN_CONTAINER_TYPE:
                num_run_containers++;
                run_zone_size += counts[i] * sizeof(rle16_t);
                break;
            case ARRAY_CONTAINER_TYPE:
                num_array_containers++;
                array_zone_size += (counts[i] + UINT32_C(1)) * sizeof(uint16_t);
                break;
            default:
                return NULL;
        }
    }
    if (length != bitset_zone_size + run_zone_size + array_zone_size +
                  5 * num_containers + 4) {
        return NULL;
    }
    uint64_t *bitset_zone = (uint64_t*) (buf);
    rle16_t *run_zone = (rle16_t*) (buf + bitset_zone_size);
    uint16_t *array_zone = (uint16_t*) (buf + bitset_zone_size + run_zone_size);

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t*);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);

    char *arena = (char *)malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb = (roaring_bitmap_t *)
            arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.keys = (uint16_t *)keys;
    rb->high_low_container.typecodes = (uint8_t *)typecodes;
    rb->high_low_container.containers =
        (container_t **)arena_alloc(&arena,
                                    sizeof(container_t*) * num_containers);
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_container_t *bitset = (bitset_container_t *)
                        arena_alloc(&arena, sizeof(bitset_container_t));
                bitset->words = bitset_zone;
                bitset->cardinality = counts[i] + UINT32_C(1);
                rb->high_low_container.containers[i] = bitset;
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                break;
            }
            case RUN_CONTAINER_TYPE: {
                run_container_t *run = (run_container_t *)
                        arena_alloc(&arena, sizeof(run_container_t));
                run->capacity = counts[i];
                run->n_runs = counts[i];
                run->runs = run_zone;
                rb->high_low_container.containers[i] = run;
                run_zone += run->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                array_container_t *array = (array_container_t *)
                        arena_alloc(&arena, sizeof(array_container_t));
                array->capacity = counts[i] + UINT32_C(1);
                array->cardinality = counts[i] + UINT32_C(1);
                array->array = array_zone;
                rb->high_low_container.containers[i] = array;
                array_zone += counts[i] + UINT32_C(1);
                break;
            }
            default:
                free(arena);
                return NULL;
        }
    }

    return rb;
}